

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O1

void testCompositeDeepScanLine(string *tempDir)

{
  char cVar1;
  int iVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\nTesting deep compositing interface basic functionality:\n",
             0x3a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  cVar1 = IlmThread_3_2::supportsThreads();
  iVar2 = 1;
  random_reseed(1);
  do {
    anon_unknown.dwarf_8556a::test_parts<float>(0,1,true,true,tempDir);
    anon_unknown.dwarf_8556a::test_parts<float>(0,1,false,false,tempDir);
    anon_unknown.dwarf_8556a::test_parts<Imath_3_2::half>(0,1,true,false,tempDir);
    anon_unknown.dwarf_8556a::test_parts<Imath_3_2::half>(0,1,false,true,tempDir);
    anon_unknown.dwarf_8556a::test_parts<float>(1,1,true,false,tempDir);
    anon_unknown.dwarf_8556a::test_parts<float>(1,1,false,true,tempDir);
    anon_unknown.dwarf_8556a::test_parts<Imath_3_2::half>(1,1,true,true,tempDir);
    anon_unknown.dwarf_8556a::test_parts<Imath_3_2::half>(1,1,false,false,tempDir);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Testing deep compositing across multiple parts:\n",0x30);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    anon_unknown.dwarf_8556a::test_parts<float>(0,5,true,false,tempDir);
    anon_unknown.dwarf_8556a::test_parts<float>(0,5,false,true,tempDir);
    anon_unknown.dwarf_8556a::test_parts<Imath_3_2::half>(0,5,true,false,tempDir);
    anon_unknown.dwarf_8556a::test_parts<Imath_3_2::half>(0,5,false,true,tempDir);
    anon_unknown.dwarf_8556a::test_parts<float>(1,3,true,true,tempDir);
    anon_unknown.dwarf_8556a::test_parts<float>(1,3,false,false,tempDir);
    anon_unknown.dwarf_8556a::test_parts<Imath_3_2::half>(1,3,true,true,tempDir);
    anon_unknown.dwarf_8556a::test_parts<Imath_3_2::half>(1,3,false,false,tempDir);
    anon_unknown.dwarf_8556a::test_parts<float>(1,4,true,true,tempDir);
    anon_unknown.dwarf_8556a::test_parts<float>(1,4,false,false,tempDir);
    anon_unknown.dwarf_8556a::test_parts<Imath_3_2::half>(1,4,true,false,tempDir);
    anon_unknown.dwarf_8556a::test_parts<Imath_3_2::half>(1,4,false,true,tempDir);
    if (iVar2 == 1 && cVar1 == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," testing with multithreading...\n",0x20);
      Imf_3_2::setGlobalThreadCount(0x40);
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 == 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ok\n",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return;
}

Assistant:

void
testCompositeDeepScanLine (const std::string& tempDir)
{

    cout << "\n\nTesting deep compositing interface basic functionality:\n"
         << endl;

    int passes = 2;
    if (!ILMTHREAD_NAMESPACE::supportsThreads ()) { passes = 1; }

    random_reseed (1);

    for (int pass = 0; pass < 2; pass++)
    {

        test_parts<float> (0, 1, true, true, tempDir);
        test_parts<float> (0, 1, false, false, tempDir);
        test_parts<half> (0, 1, true, false, tempDir);
        test_parts<half> (0, 1, false, true, tempDir);

        //
        // test pattern 1: tested by confirming data is written correctly and
        // then reading correct results in Nuke
        //
        test_parts<float> (1, 1, true, false, tempDir);
        test_parts<float> (1, 1, false, true, tempDir);
        test_parts<half> (1, 1, true, true, tempDir);
        test_parts<half> (1, 1, false, false, tempDir);

        cout << "Testing deep compositing across multiple parts:\n" << endl;

        test_parts<float> (0, 5, true, false, tempDir);
        test_parts<float> (0, 5, false, true, tempDir);
        test_parts<half> (0, 5, true, false, tempDir);
        test_parts<half> (0, 5, false, true, tempDir);

        test_parts<float> (1, 3, true, true, tempDir);
        test_parts<float> (1, 3, false, false, tempDir);
        test_parts<half> (1, 3, true, true, tempDir);
        test_parts<half> (1, 3, false, false, tempDir);

        test_parts<float> (1, 4, true, true, tempDir);
        test_parts<float> (1, 4, false, false, tempDir);
        test_parts<half> (1, 4, true, false, tempDir);
        test_parts<half> (1, 4, false, true, tempDir);

        if (passes == 2 && pass == 0)
        {
            cout << " testing with multithreading...\n";
            setGlobalThreadCount (64);
        }
    }
    cout << " ok\n" << endl;
}